

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall
helics::CommonCore::processCommunications
          (CommonCore *this,LocalFederateId federateID,milliseconds msToWait)

{
  FederateStates FVar1;
  FederateState *this_00;
  InvalidFunctionCall *this_01;
  pointer_____offset_0x10___ *ppuVar2;
  string_view message;
  string_view message_00;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid (processCommunications)";
    message._M_len = 0x2c;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar2 = &InvalidIdentifier::typeinfo;
  }
  else {
    if (this_00->mCallbackBased != true) {
      FVar1 = FederateState::getState(this_00);
      if ((FVar1 != TERMINATING) && (FVar1 != FINISHED)) {
        FederateState::processCommunications(this_00,msToWait);
        return;
      }
      return;
    }
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message_00._M_str = "process Comms operation is not permitted for callback based federates";
    message_00._M_len = 0x45;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message_00);
    ppuVar2 = &InvalidFunctionCall::typeinfo;
  }
  __cxa_throw(this_01,ppuVar2,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::processCommunications(LocalFederateId federateID,
                                       std::chrono::milliseconds msToWait)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid (processCommunications)"));
    }
    if (fed->isCallbackFederate()) {
        throw(InvalidFunctionCall(
            "process Comms operation is not permitted for callback based federates"));
    }
    switch (fed->getState()) {
        case FederateStates::FINISHED:
        case FederateStates::TERMINATING:
            return;
        default:
            break;
    }
    fed->processCommunications(msToWait);
}